

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::Demangle(char *mangled,char *out,int out_size)

{
  bool bVar1;
  byte local_51;
  undefined1 local_50 [8];
  State state;
  int out_size_local;
  char *out_local;
  char *mangled_local;
  
  state._44_4_ = out_size;
  InitState((State *)local_50,mangled,out,out_size);
  bVar1 = ParseTopLevelMangledName((State *)local_50);
  local_51 = 0;
  if (bVar1) {
    local_51 = state.prev_name._7_1_ ^ 0xff;
  }
  return (bool)(local_51 & 1);
}

Assistant:

bool Demangle(const char *mangled, char *out, int out_size) {
#if defined(OS_WINDOWS)
  // When built with incremental linking, the Windows debugger
  // library provides a more complicated `Symbol->Name` with the
  // Incremental Linking Table offset, which looks like
  // `@ILT+1105(?func@Foo@@SAXH@Z)`. However, the demangler expects
  // only the mangled symbol, `?func@Foo@@SAXH@Z`. Fortunately, the
  // mangled symbol is guaranteed not to have parentheses,
  // so we search for `(` and extract up to `)`.
  //
  // Since we may be in a signal handler here, we cannot use `std::string`.
  char buffer[1024];  // Big enough for a sane symbol.
  const char *lparen = strchr(mangled, '(');
  if (lparen) {
    // Extract the string `(?...)`
    const char *rparen = strchr(lparen, ')');
    size_t length = rparen - lparen - 1;
    strncpy(buffer, lparen + 1, length);
    buffer[length] = '\0';
    mangled = buffer;
  } // Else the symbol wasn't inside a set of parentheses
  // We use the ANSI version to ensure the string type is always `char *`.
  return UnDecorateSymbolName(mangled, out, out_size, UNDNAME_COMPLETE);
#else
  State state;
  InitState(&state, mangled, out, out_size);
  return ParseTopLevelMangledName(&state) && !state.overflowed;
#endif
}